

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O0

void TemplateCacheUnittest::TestExpandNoLoad(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  bool bVar3;
  byte bVar4;
  TemplateString local_5e0;
  TemplateString local_5c0;
  TemplateString local_5a0;
  TemplateString local_580;
  TemplateString local_560;
  TemplateString local_540;
  TemplateString local_520;
  TemplateString local_500;
  TemplateString local_4e0;
  TemplateString local_4c0;
  TemplateString local_4a0;
  TemplateString local_480;
  TemplateString local_460;
  TemplateString local_440;
  TemplateString local_420;
  TemplateString local_400;
  TemplateString local_3e0;
  TemplateString local_3c0;
  TemplateString local_3a0;
  TemplateString local_380;
  TemplateString local_360;
  TemplateString local_340;
  TemplateString local_320;
  TemplateString local_300;
  TemplateString local_2e0;
  TemplateString local_2c0;
  TemplateString local_2a0;
  TemplateString local_280;
  TemplateString local_260;
  TemplateString local_240;
  string local_220 [8];
  string out;
  TemplateString local_200;
  TemplateString local_1e0;
  TemplateString local_1c0;
  TemplateDictionary local_1a0 [8];
  TemplateDictionary dict;
  allocator local_129;
  string local_128 [32];
  ctemplate local_108 [8];
  string inc_filename;
  allocator local_e1;
  string local_e0 [32];
  ctemplate local_c0 [8];
  string top_filename;
  allocator local_89;
  string local_88 [32];
  ctemplate local_68 [8];
  string filename;
  undefined1 local_48 [8];
  TemplateCache cache;
  
  ctemplate::TemplateCache::TemplateCache((TemplateCache *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"alone",&local_89);
  ctemplate::StringToTemplateFile(local_68,(string *)local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"Hello, {{>WORLD}}",&local_e1);
  ctemplate::StringToTemplateFile(local_c0,(string *)local_e0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"world",&local_129);
  ctemplate::StringToTemplateFile(local_108,(string *)local_128);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  ctemplate::TemplateString::TemplateString(&local_1c0,"ExpandNoLoad");
  ctemplate::TemplateDictionary::TemplateDictionary(local_1a0,&local_1c0,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_1e0,"WORLD");
  TVar1.length_ = local_1e0.length_;
  TVar1.ptr_ = local_1e0.ptr_;
  TVar1.is_immutable_ = local_1e0.is_immutable_;
  TVar1._17_7_ = local_1e0._17_7_;
  TVar1.id_ = local_1e0.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar1);
  ctemplate::TemplateString::TemplateString(&local_200,(string *)local_108);
  TVar2.length_ = local_200.length_;
  TVar2.ptr_ = local_200.ptr_;
  TVar2.is_immutable_ = local_200.is_immutable_;
  TVar2._17_7_ = local_200._17_7_;
  TVar2.id_ = local_200.id_;
  ctemplate::TemplateDictionary::SetFilename(TVar2);
  std::__cxx11::string::string(local_220);
  ctemplate::TemplateCache::Freeze();
  ctemplate::TemplateString::TemplateString(&local_240,(string *)local_68);
  bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                    ((TemplateCache *)local_48,&local_240,DO_NOT_STRIP,
                     (TemplateDictionaryInterface *)local_1a0,(PerExpandData *)0x0,
                     (string *)local_220);
  if (bVar3) {
    printf("ASSERT FAILED, line %d: %s\n",0xcc,
           "!cache.ExpandNoLoad(filename, DO_NOT_STRIP, &dict, NULL, &out)");
    ctemplate::TemplateString::TemplateString(&local_260,(string *)local_68);
    bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                      ((TemplateCache *)local_48,&local_260,DO_NOT_STRIP,
                       (TemplateDictionaryInterface *)local_1a0,(PerExpandData *)0x0,
                       (string *)local_220);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      __assert_fail("!cache.ExpandNoLoad(filename, DO_NOT_STRIP, &dict, __null, &out)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0xcc,"static void TemplateCacheUnittest::TestExpandNoLoad()");
    }
    exit(1);
  }
  ctemplate::TemplateCache::ClearCache();
  ctemplate::TemplateString::TemplateString(&local_280,(string *)local_68);
  bVar3 = ctemplate::TemplateCache::ExpandWithData
                    ((TemplateCache *)local_48,&local_280,DO_NOT_STRIP,
                     (TemplateDictionaryInterface *)local_1a0,(PerExpandData *)0x0,
                     (string *)local_220);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0xd0,
           "cache.ExpandWithData(filename, DO_NOT_STRIP, &dict, NULL, &out)");
    ctemplate::TemplateString::TemplateString(&local_2a0,(string *)local_68);
    bVar3 = ctemplate::TemplateCache::ExpandWithData
                      ((TemplateCache *)local_48,&local_2a0,DO_NOT_STRIP,
                       (TemplateDictionaryInterface *)local_1a0,(PerExpandData *)0x0,
                       (string *)local_220);
    if (!bVar3) {
      __assert_fail("cache.ExpandWithData(filename, DO_NOT_STRIP, &dict, __null, &out)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0xd0,"static void TemplateCacheUnittest::TestExpandNoLoad()");
    }
    exit(1);
  }
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_220,"alone");
  if (!bVar3) {
    printf("ASSERT FAILED, line %d: %s\n",0xd1,"out == \"alone\"");
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_220,"alone");
    if (!bVar3) {
      __assert_fail("out == \"alone\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0xd1,"static void TemplateCacheUnittest::TestExpandNoLoad()");
    }
    exit(1);
  }
  std::__cxx11::string::clear();
  ctemplate::TemplateCache::Freeze();
  ctemplate::TemplateString::TemplateString(&local_2c0,(string *)local_68);
  bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                    ((TemplateCache *)local_48,&local_2c0,DO_NOT_STRIP,
                     (TemplateDictionaryInterface *)local_1a0,(PerExpandData *)0x0,
                     (string *)local_220);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0xd5,
           "cache.ExpandNoLoad(filename, DO_NOT_STRIP, &dict, NULL, &out)");
    ctemplate::TemplateString::TemplateString(&local_2e0,(string *)local_68);
    bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                      ((TemplateCache *)local_48,&local_2e0,DO_NOT_STRIP,
                       (TemplateDictionaryInterface *)local_1a0,(PerExpandData *)0x0,
                       (string *)local_220);
    if (!bVar3) {
      __assert_fail("cache.ExpandNoLoad(filename, DO_NOT_STRIP, &dict, __null, &out)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0xd5,"static void TemplateCacheUnittest::TestExpandNoLoad()");
    }
    exit(1);
  }
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_220,"alone");
  if (!bVar3) {
    printf("ASSERT FAILED, line %d: %s\n",0xd6,"out == \"alone\"");
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_220,"alone");
    if (!bVar3) {
      __assert_fail("out == \"alone\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0xd6,"static void TemplateCacheUnittest::TestExpandNoLoad()");
    }
    exit(1);
  }
  std::__cxx11::string::clear();
  ctemplate::TemplateCache::ClearCache();
  ctemplate::TemplateCache::Freeze();
  ctemplate::TemplateString::TemplateString(&local_300,(string *)local_c0);
  bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                    ((TemplateCache *)local_48,&local_300,DO_NOT_STRIP,
                     (TemplateDictionaryInterface *)local_1a0,(PerExpandData *)0x0,
                     (string *)local_220);
  if (bVar3) {
    printf("ASSERT FAILED, line %d: %s\n",0xdc,
           "!cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out)");
    ctemplate::TemplateString::TemplateString(&local_320,(string *)local_c0);
    bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                      ((TemplateCache *)local_48,&local_320,DO_NOT_STRIP,
                       (TemplateDictionaryInterface *)local_1a0,(PerExpandData *)0x0,
                       (string *)local_220);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      __assert_fail("!cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, __null, &out)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0xdc,"static void TemplateCacheUnittest::TestExpandNoLoad()");
    }
    exit(1);
  }
  ctemplate::TemplateCache::ClearCache();
  ctemplate::TemplateString::TemplateString(&local_340,(string *)local_c0);
  bVar4 = ctemplate::TemplateCache::LoadTemplate((TemplateString *)local_48,(Strip)&local_340);
  if (((bVar4 ^ 0xff) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0xde,"cache.LoadTemplate(top_filename, DO_NOT_STRIP)");
    ctemplate::TemplateString::TemplateString(&local_360,(string *)local_c0);
    bVar4 = ctemplate::TemplateCache::LoadTemplate((TemplateString *)local_48,(Strip)&local_360);
    if ((bVar4 & 1) == 0) {
      __assert_fail("cache.LoadTemplate(top_filename, DO_NOT_STRIP)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0xde,"static void TemplateCacheUnittest::TestExpandNoLoad()");
    }
    exit(1);
  }
  ctemplate::TemplateCache::Freeze();
  ctemplate::TemplateString::TemplateString(&local_380,(string *)local_c0);
  bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                    ((TemplateCache *)local_48,&local_380,DO_NOT_STRIP,
                     (TemplateDictionaryInterface *)local_1a0,(PerExpandData *)0x0,
                     (string *)local_220);
  if (bVar3) {
    printf("ASSERT FAILED, line %d: %s\n",0xe1,
           "!cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out)");
    ctemplate::TemplateString::TemplateString(&local_3a0,(string *)local_c0);
    bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                      ((TemplateCache *)local_48,&local_3a0,DO_NOT_STRIP,
                       (TemplateDictionaryInterface *)local_1a0,(PerExpandData *)0x0,
                       (string *)local_220);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      __assert_fail("!cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, __null, &out)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0xe1,"static void TemplateCacheUnittest::TestExpandNoLoad()");
    }
    exit(1);
  }
  std::__cxx11::string::clear();
  ctemplate::TemplateCache::ClearCache();
  ctemplate::TemplateString::TemplateString(&local_3c0,(string *)local_c0);
  bVar4 = ctemplate::TemplateCache::LoadTemplate((TemplateString *)local_48,(Strip)&local_3c0);
  if (((bVar4 ^ 0xff) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0xe6,"cache.LoadTemplate(top_filename, DO_NOT_STRIP)");
    ctemplate::TemplateString::TemplateString(&local_3e0,(string *)local_c0);
    bVar4 = ctemplate::TemplateCache::LoadTemplate((TemplateString *)local_48,(Strip)&local_3e0);
    if ((bVar4 & 1) == 0) {
      __assert_fail("cache.LoadTemplate(top_filename, DO_NOT_STRIP)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0xe6,"static void TemplateCacheUnittest::TestExpandNoLoad()");
    }
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_400,(string *)local_108);
  bVar4 = ctemplate::TemplateCache::LoadTemplate((TemplateString *)local_48,(Strip)&local_400);
  if (((bVar4 ^ 0xff) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0xe7,"cache.LoadTemplate(inc_filename, DO_NOT_STRIP)");
    ctemplate::TemplateString::TemplateString(&local_420,(string *)local_108);
    bVar4 = ctemplate::TemplateCache::LoadTemplate((TemplateString *)local_48,(Strip)&local_420);
    if ((bVar4 & 1) == 0) {
      __assert_fail("cache.LoadTemplate(inc_filename, DO_NOT_STRIP)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0xe7,"static void TemplateCacheUnittest::TestExpandNoLoad()");
    }
    exit(1);
  }
  ctemplate::TemplateCache::Freeze();
  ctemplate::TemplateString::TemplateString(&local_440,(string *)local_c0);
  bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                    ((TemplateCache *)local_48,&local_440,DO_NOT_STRIP,
                     (TemplateDictionaryInterface *)local_1a0,(PerExpandData *)0x0,
                     (string *)local_220);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0xea,
           "cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out)");
    ctemplate::TemplateString::TemplateString(&local_460,(string *)local_c0);
    bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                      ((TemplateCache *)local_48,&local_460,DO_NOT_STRIP,
                       (TemplateDictionaryInterface *)local_1a0,(PerExpandData *)0x0,
                       (string *)local_220);
    if (!bVar3) {
      __assert_fail("cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, __null, &out)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0xea,"static void TemplateCacheUnittest::TestExpandNoLoad()");
    }
    exit(1);
  }
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_220,"Hello, world");
  if (!bVar3) {
    printf("ASSERT FAILED, line %d: %s\n",0xeb,"out == \"Hello, world\"");
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_220,"Hello, world");
    if (!bVar3) {
      __assert_fail("out == \"Hello, world\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0xeb,"static void TemplateCacheUnittest::TestExpandNoLoad()");
    }
    exit(1);
  }
  std::__cxx11::string::clear();
  ctemplate::TemplateString::TemplateString(&local_480,(string *)local_c0);
  bVar3 = ctemplate::TemplateCache::ExpandWithData
                    ((TemplateCache *)local_48,&local_480,DO_NOT_STRIP,
                     (TemplateDictionaryInterface *)local_1a0,(PerExpandData *)0x0,
                     (string *)local_220);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0xee,
           "cache.ExpandWithData(top_filename, DO_NOT_STRIP, &dict, NULL, &out)");
    ctemplate::TemplateString::TemplateString(&local_4a0,(string *)local_c0);
    bVar3 = ctemplate::TemplateCache::ExpandWithData
                      ((TemplateCache *)local_48,&local_4a0,DO_NOT_STRIP,
                       (TemplateDictionaryInterface *)local_1a0,(PerExpandData *)0x0,
                       (string *)local_220);
    if (!bVar3) {
      __assert_fail("cache.ExpandWithData(top_filename, DO_NOT_STRIP, &dict, __null, &out)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0xee,"static void TemplateCacheUnittest::TestExpandNoLoad()");
    }
    exit(1);
  }
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_220,"Hello, world");
  if (!bVar3) {
    printf("ASSERT FAILED, line %d: %s\n",0xef,"out == \"Hello, world\"");
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_220,"Hello, world");
    if (!bVar3) {
      __assert_fail("out == \"Hello, world\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0xef,"static void TemplateCacheUnittest::TestExpandNoLoad()");
    }
    exit(1);
  }
  std::__cxx11::string::clear();
  ctemplate::TemplateCache::ClearCache();
  ctemplate::TemplateString::TemplateString(&local_4c0,(string *)local_c0);
  bVar3 = ctemplate::TemplateCache::ExpandWithData
                    ((TemplateCache *)local_48,&local_4c0,DO_NOT_STRIP,
                     (TemplateDictionaryInterface *)local_1a0,(PerExpandData *)0x0,
                     (string *)local_220);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0xf3,
           "cache.ExpandWithData(top_filename, DO_NOT_STRIP, &dict, NULL, &out)");
    ctemplate::TemplateString::TemplateString(&local_4e0,(string *)local_c0);
    bVar3 = ctemplate::TemplateCache::ExpandWithData
                      ((TemplateCache *)local_48,&local_4e0,DO_NOT_STRIP,
                       (TemplateDictionaryInterface *)local_1a0,(PerExpandData *)0x0,
                       (string *)local_220);
    if (!bVar3) {
      __assert_fail("cache.ExpandWithData(top_filename, DO_NOT_STRIP, &dict, __null, &out)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0xf3,"static void TemplateCacheUnittest::TestExpandNoLoad()");
    }
    exit(1);
  }
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_220,"Hello, world");
  if (!bVar3) {
    printf("ASSERT FAILED, line %d: %s\n",0xf4,"out == \"Hello, world\"");
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_220,"Hello, world");
    if (!bVar3) {
      __assert_fail("out == \"Hello, world\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0xf4,"static void TemplateCacheUnittest::TestExpandNoLoad()");
    }
    exit(1);
  }
  std::__cxx11::string::clear();
  ctemplate::TemplateCache::Freeze();
  ctemplate::TemplateString::TemplateString(&local_500,(string *)local_c0);
  bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                    ((TemplateCache *)local_48,&local_500,DO_NOT_STRIP,
                     (TemplateDictionaryInterface *)local_1a0,(PerExpandData *)0x0,
                     (string *)local_220);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0xf8,
           "cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out)");
    ctemplate::TemplateString::TemplateString(&local_520,(string *)local_c0);
    bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                      ((TemplateCache *)local_48,&local_520,DO_NOT_STRIP,
                       (TemplateDictionaryInterface *)local_1a0,(PerExpandData *)0x0,
                       (string *)local_220);
    if (!bVar3) {
      __assert_fail("cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, __null, &out)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0xf8,"static void TemplateCacheUnittest::TestExpandNoLoad()");
    }
    exit(1);
  }
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_220,"Hello, world");
  if (!bVar3) {
    printf("ASSERT FAILED, line %d: %s\n",0xf9,"out == \"Hello, world\"");
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_220,"Hello, world");
    if (!bVar3) {
      __assert_fail("out == \"Hello, world\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0xf9,"static void TemplateCacheUnittest::TestExpandNoLoad()");
    }
    exit(1);
  }
  std::__cxx11::string::clear();
  ctemplate::TemplateCache::ClearCache();
  ctemplate::TemplateString::TemplateString(&local_540,(string *)local_c0);
  bVar4 = ctemplate::TemplateCache::LoadTemplate((TemplateString *)local_48,(Strip)&local_540);
  if (((bVar4 ^ 0xff) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0xfd,"cache.LoadTemplate(top_filename, DO_NOT_STRIP)");
    ctemplate::TemplateString::TemplateString(&local_560,(string *)local_c0);
    bVar4 = ctemplate::TemplateCache::LoadTemplate((TemplateString *)local_48,(Strip)&local_560);
    if ((bVar4 & 1) == 0) {
      __assert_fail("cache.LoadTemplate(top_filename, DO_NOT_STRIP)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0xfd,"static void TemplateCacheUnittest::TestExpandNoLoad()");
    }
    exit(1);
  }
  ctemplate::TemplateCache::Freeze();
  ctemplate::TemplateString::TemplateString(&local_580,(string *)local_108);
  bVar4 = ctemplate::TemplateCache::LoadTemplate((TemplateString *)local_48,(Strip)&local_580);
  if ((bVar4 & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x100,"!cache.LoadTemplate(inc_filename, DO_NOT_STRIP)");
    ctemplate::TemplateString::TemplateString(&local_5a0,(string *)local_108);
    bVar4 = ctemplate::TemplateCache::LoadTemplate((TemplateString *)local_48,(Strip)&local_5a0);
    if (((bVar4 ^ 0xff) & 1) == 0) {
      __assert_fail("!cache.LoadTemplate(inc_filename, DO_NOT_STRIP)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x100,"static void TemplateCacheUnittest::TestExpandNoLoad()");
    }
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_5c0,(string *)local_c0);
  bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                    ((TemplateCache *)local_48,&local_5c0,DO_NOT_STRIP,
                     (TemplateDictionaryInterface *)local_1a0,(PerExpandData *)0x0,
                     (string *)local_220);
  if (!bVar3) {
    std::__cxx11::string::~string(local_220);
    ctemplate::TemplateDictionary::~TemplateDictionary(local_1a0);
    std::__cxx11::string::~string((string *)local_108);
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string((string *)local_68);
    ctemplate::TemplateCache::~TemplateCache((TemplateCache *)local_48);
    return;
  }
  printf("ASSERT FAILED, line %d: %s\n",0x102,
         "!cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out)");
  ctemplate::TemplateString::TemplateString(&local_5e0,(string *)local_c0);
  bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                    ((TemplateCache *)local_48,&local_5e0,DO_NOT_STRIP,
                     (TemplateDictionaryInterface *)local_1a0,(PerExpandData *)0x0,
                     (string *)local_220);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    __assert_fail("!cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, __null, &out)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x102,"static void TemplateCacheUnittest::TestExpandNoLoad()");
  }
  exit(1);
}

Assistant:

static void TestExpandNoLoad() {
    TemplateCache cache;
    string filename = StringToTemplateFile("alone");
    string top_filename = StringToTemplateFile("Hello, {{>WORLD}}");
    string inc_filename = StringToTemplateFile("world");

    TemplateDictionary dict("ExpandNoLoad");
    dict.AddIncludeDictionary("WORLD")->SetFilename(inc_filename);
    string out;

    // This should fail because the cache is empty.
    cache.Freeze();
    ASSERT(!cache.ExpandNoLoad(filename, DO_NOT_STRIP, &dict, NULL, &out));

    cache.ClearCache();   // also clears the "frozen" state
    // This should succeed -- it loads inc_filename from disk.
    ASSERT(cache.ExpandWithData(filename, DO_NOT_STRIP, &dict, NULL, &out));
    ASSERT(out == "alone");
    out.clear();
    // Now this should succeed -- it's in the cache.
    cache.Freeze();
    ASSERT(cache.ExpandNoLoad(filename, DO_NOT_STRIP, &dict, NULL, &out));
    ASSERT(out == "alone");
    out.clear();

    // This should fail because neither top nor inc are in the cache.
    cache.ClearCache();
    cache.Freeze();
    ASSERT(!cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out));
    cache.ClearCache();
    ASSERT(cache.LoadTemplate(top_filename, DO_NOT_STRIP));
    // This *should* fail, but because inc_filename isn't in the cache.
    cache.Freeze();
    ASSERT(!cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out));
    // TODO(csilvers): this should not be necessary.  But expand writes
    //                 to its output even before it fails.
    out.clear();
    cache.ClearCache();
    ASSERT(cache.LoadTemplate(top_filename, DO_NOT_STRIP));
    ASSERT(cache.LoadTemplate(inc_filename, DO_NOT_STRIP));
    cache.Freeze();
    // *Now* it should succeed, with everything it needs loaded.
    ASSERT(cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out));
    ASSERT(out == "Hello, world");
    out.clear();
    // This should succeed too, of course.
    ASSERT(cache.ExpandWithData(top_filename, DO_NOT_STRIP, &dict, NULL, &out));
    ASSERT(out == "Hello, world");
    out.clear();

    cache.ClearCache();
    ASSERT(cache.ExpandWithData(top_filename, DO_NOT_STRIP, &dict, NULL, &out));
    ASSERT(out == "Hello, world");
    out.clear();
    // Now everything NoLoad needs should be in the cache again.
    cache.Freeze();
    ASSERT(cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out));
    ASSERT(out == "Hello, world");
    out.clear();

    cache.ClearCache();
    ASSERT(cache.LoadTemplate(top_filename, DO_NOT_STRIP));
    cache.Freeze();
    // This fails, of course, because we're frozen.
    ASSERT(!cache.LoadTemplate(inc_filename, DO_NOT_STRIP));
    // And thus, this fails too.
    ASSERT(!cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out));
  }